

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplify.cc
# Opt level: O0

Regexp * __thiscall
re2::SimplifyWalker::PostVisit
          (SimplifyWalker *this,Regexp *re,Regexp *parent_arg,Regexp *pre_arg,Regexp **child_args,
          int nchild_args)

{
  bool bVar1;
  RegexpOp RVar2;
  int iVar3;
  int iVar4;
  RegexpOp RVar5;
  ParseFlags PVar6;
  ParseFlags PVar7;
  Regexp **ppRVar8;
  Regexp *pRVar9;
  LogMessage *this_00;
  ostream *this_01;
  Regexp *in_RCX;
  Regexp *in_RSI;
  long *in_R8;
  ParseFlags in_R9D;
  Regexp *nre_4;
  Regexp *nre_3;
  Regexp *newsub_2;
  Regexp *nre_2;
  Regexp *newsub_1;
  Regexp *nre_1;
  Regexp *newsub;
  int i;
  Regexp **nre_subs;
  Regexp *nre;
  ParseFlags in_stack_fffffffffffffd38;
  RegexpOp in_stack_fffffffffffffd3c;
  Regexp *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd60;
  undefined4 in_stack_fffffffffffffd64;
  Regexp *in_stack_fffffffffffffd68;
  int in_stack_fffffffffffffd74;
  Regexp *in_stack_fffffffffffffd78;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  Regexp *in_stack_fffffffffffffd90;
  LogMessage local_218;
  Regexp *local_90;
  Regexp *local_88;
  Regexp *local_80;
  Regexp *local_78;
  Regexp *local_70;
  Regexp *local_68;
  int local_5c;
  Regexp **local_58;
  Regexp *local_40;
  Regexp *local_8;
  
  RVar2 = Regexp::op(in_RSI);
  switch(RVar2) {
  case kRegexpNoMatch:
  case kRegexpEmptyMatch:
  case kRegexpLiteral:
  case kRegexpLiteralString:
  case kRegexpAnyChar:
  case kRegexpAnyByte:
  case kRegexpBeginLine:
  case kRegexpEndLine:
  case kRegexpWordBoundary:
  case kRegexpNoWordBoundary:
  case kRegexpBeginText:
  case kRegexpEndText:
  case kMaxRegexpOp:
    in_RSI->simple_ = '\x01';
    local_8 = Regexp::Incref(in_stack_fffffffffffffd78);
    break;
  case kRegexpConcat:
  case kRegexpAlternate:
    bVar1 = ChildArgsChanged(in_stack_fffffffffffffd68,
                             (Regexp **)
                             CONCAT44(in_stack_fffffffffffffd64,in_stack_fffffffffffffd60));
    if (bVar1) {
      pRVar9 = (Regexp *)operator_new(0x28);
      Regexp::op(in_RSI);
      Regexp::parse_flags(in_RSI);
      Regexp::Regexp(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
      local_40 = pRVar9;
      Regexp::nsub(in_RSI);
      Regexp::AllocSub(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      local_58 = Regexp::sub(local_40);
      for (local_5c = 0; iVar4 = local_5c, iVar3 = Regexp::nsub(in_RSI), iVar4 < iVar3;
          local_5c = local_5c + 1) {
        local_58[local_5c] = (Regexp *)in_R8[local_5c];
      }
      local_40->simple_ = '\x01';
      local_8 = local_40;
    }
    else {
      in_RSI->simple_ = '\x01';
      local_8 = Regexp::Incref(in_stack_fffffffffffffd78);
    }
    break;
  case kRegexpStar:
  case kRegexpPlus:
  case kRegexpQuest:
    local_78 = (Regexp *)*in_R8;
    RVar2 = Regexp::op(local_78);
    if (RVar2 == kRegexpEmptyMatch) {
      local_8 = local_78;
    }
    else {
      pRVar9 = local_78;
      ppRVar8 = Regexp::sub(in_RSI);
      if (pRVar9 == *ppRVar8) {
        Regexp::Decref(pRVar9);
        in_RSI->simple_ = '\x01';
        local_8 = Regexp::Incref(in_stack_fffffffffffffd78);
      }
      else {
        RVar2 = Regexp::op(in_RSI);
        RVar5 = Regexp::op(local_78);
        if (RVar2 == RVar5) {
          PVar6 = Regexp::parse_flags(in_RSI);
          PVar7 = Regexp::parse_flags(local_78);
          if (PVar6 == PVar7) {
            return local_78;
          }
        }
        pRVar9 = (Regexp *)operator_new(0x28);
        Regexp::op(in_RSI);
        Regexp::parse_flags(in_RSI);
        Regexp::Regexp(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38
                      );
        local_80 = pRVar9;
        Regexp::AllocSub(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
        ppRVar8 = Regexp::sub(local_80);
        *ppRVar8 = local_78;
        local_80->simple_ = '\x01';
        local_8 = local_80;
      }
    }
    break;
  case kRegexpRepeat:
    local_88 = (Regexp *)*in_R8;
    RVar2 = Regexp::op(local_88);
    if (RVar2 == kRegexpEmptyMatch) {
      local_8 = local_88;
    }
    else {
      Regexp::parse_flags(in_RSI);
      local_90 = SimplifyRepeat(in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,in_R9D);
      Regexp::Decref(in_stack_fffffffffffffd90);
      local_90->simple_ = '\x01';
      local_8 = local_90;
    }
    break;
  case kRegexpCapture:
    pRVar9 = (Regexp *)*in_R8;
    local_68 = pRVar9;
    ppRVar8 = Regexp::sub(in_RSI);
    if (pRVar9 == *ppRVar8) {
      Regexp::Decref(in_stack_fffffffffffffd90);
      in_RSI->simple_ = '\x01';
      local_8 = Regexp::Incref(in_stack_fffffffffffffd78);
    }
    else {
      pRVar9 = (Regexp *)operator_new(0x28);
      Regexp::parse_flags(in_RSI);
      Regexp::Regexp(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38);
      local_70 = pRVar9;
      Regexp::AllocSub(in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
      pRVar9 = local_68;
      ppRVar8 = Regexp::sub(local_70);
      *ppRVar8 = pRVar9;
      iVar4 = Regexp::cap(in_RSI);
      (local_70->field_7).field_0.max_ = iVar4;
      local_70->simple_ = '\x01';
      local_8 = local_70;
    }
    break;
  case kRegexpCharClass:
    local_8 = SimplifyCharClass(in_stack_fffffffffffffd68);
    local_8->simple_ = '\x01';
    break;
  default:
    LogMessage::LogMessage
              ((LogMessage *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
               (char *)in_stack_fffffffffffffd78,in_stack_fffffffffffffd74);
    this_00 = (LogMessage *)LogMessage::stream(&local_218);
    this_01 = std::operator<<((ostream *)this_00,"Simplify case not handled: ");
    RVar2 = Regexp::op(in_RSI);
    std::ostream::operator<<(this_01,RVar2);
    LogMessage::~LogMessage(this_00);
    local_8 = Regexp::Incref(in_stack_fffffffffffffd78);
  }
  return local_8;
}

Assistant:

Regexp* SimplifyWalker::PostVisit(Regexp* re,
                                  Regexp* parent_arg,
                                  Regexp* pre_arg,
                                  Regexp** child_args,
                                  int nchild_args) {
  switch (re->op()) {
    case kRegexpNoMatch:
    case kRegexpEmptyMatch:
    case kRegexpLiteral:
    case kRegexpLiteralString:
    case kRegexpBeginLine:
    case kRegexpEndLine:
    case kRegexpBeginText:
    case kRegexpWordBoundary:
    case kRegexpNoWordBoundary:
    case kRegexpEndText:
    case kRegexpAnyChar:
    case kRegexpAnyByte:
    case kRegexpHaveMatch:
      // All these are always simple.
      re->simple_ = true;
      return re->Incref();

    case kRegexpConcat:
    case kRegexpAlternate: {
      // These are simple as long as the subpieces are simple.
      if (!ChildArgsChanged(re, child_args)) {
        re->simple_ = true;
        return re->Incref();
      }
      Regexp* nre = new Regexp(re->op(), re->parse_flags());
      nre->AllocSub(re->nsub());
      Regexp** nre_subs = nre->sub();
      for (int i = 0; i < re->nsub(); i++)
        nre_subs[i] = child_args[i];
      nre->simple_ = true;
      return nre;
    }

    case kRegexpCapture: {
      Regexp* newsub = child_args[0];
      if (newsub == re->sub()[0]) {
        newsub->Decref();
        re->simple_ = true;
        return re->Incref();
      }
      Regexp* nre = new Regexp(kRegexpCapture, re->parse_flags());
      nre->AllocSub(1);
      nre->sub()[0] = newsub;
      nre->cap_ = re->cap();
      nre->simple_ = true;
      return nre;
    }

    case kRegexpStar:
    case kRegexpPlus:
    case kRegexpQuest: {
      Regexp* newsub = child_args[0];
      // Special case: repeat the empty string as much as
      // you want, but it's still the empty string.
      if (newsub->op() == kRegexpEmptyMatch)
        return newsub;

      // These are simple as long as the subpiece is simple.
      if (newsub == re->sub()[0]) {
        newsub->Decref();
        re->simple_ = true;
        return re->Incref();
      }

      // These are also idempotent if flags are constant.
      if (re->op() == newsub->op() &&
          re->parse_flags() == newsub->parse_flags())
        return newsub;

      Regexp* nre = new Regexp(re->op(), re->parse_flags());
      nre->AllocSub(1);
      nre->sub()[0] = newsub;
      nre->simple_ = true;
      return nre;
    }

    case kRegexpRepeat: {
      Regexp* newsub = child_args[0];
      // Special case: repeat the empty string as much as
      // you want, but it's still the empty string.
      if (newsub->op() == kRegexpEmptyMatch)
        return newsub;

      Regexp* nre = SimplifyRepeat(newsub, re->min_, re->max_,
                                   re->parse_flags());
      newsub->Decref();
      nre->simple_ = true;
      return nre;
    }

    case kRegexpCharClass: {
      Regexp* nre = SimplifyCharClass(re);
      nre->simple_ = true;
      return nre;
    }
  }

  LOG(ERROR) << "Simplify case not handled: " << re->op();
  return re->Incref();
}